

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineRenderToImageTests.cpp
# Opt level: O0

VkImageAspectFlags vkt::pipeline::anon_unknown_0::getFormatAspectFlags(VkFormat format)

{
  TextureFormat TVar1;
  undefined4 local_1c;
  ChannelOrder order;
  VkFormat format_local;
  
  if (format == VK_FORMAT_UNDEFINED) {
    order = R;
  }
  else {
    TVar1 = ::vk::mapVkFormat(format);
    local_1c = TVar1.order;
    if (local_1c == D) {
      order = I;
    }
    else if (local_1c == S) {
      order = LA;
    }
    else if (local_1c == DS) {
      order = RA;
    }
    else {
      order = A;
    }
  }
  return order;
}

Assistant:

VkImageAspectFlags getFormatAspectFlags (const VkFormat format)
{
	if (format == VK_FORMAT_UNDEFINED)
		return 0;

	const tcu::TextureFormat::ChannelOrder	order	= mapVkFormat(format).order;

	switch (order)
	{
		case tcu::TextureFormat::DS:	return VK_IMAGE_ASPECT_DEPTH_BIT | VK_IMAGE_ASPECT_STENCIL_BIT;
		case tcu::TextureFormat::D:		return VK_IMAGE_ASPECT_DEPTH_BIT;
		case tcu::TextureFormat::S:		return VK_IMAGE_ASPECT_STENCIL_BIT;
		default:						return VK_IMAGE_ASPECT_COLOR_BIT;
	}
}